

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Iterator.h
# Opt level: O0

Slice __thiscall arangodb::velocypack::ObjectIterator::value(ObjectIterator *this)

{
  bool bVar1;
  undefined8 uVar2;
  ValueLength VVar3;
  ObjectIterator *in_RDI;
  Slice key;
  ExceptionType in_stack_ffffffffffffffcc;
  Exception *in_stack_ffffffffffffffd0;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this_00;
  Slice in_stack_ffffffffffffffe8;
  Slice local_8;
  
  bVar1 = valid(in_RDI);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    if (in_RDI->_current == (uint8_t *)0x0) {
      local_8 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getNthValue
                          (in_stack_ffffffffffffffe8._start,(ValueLength)in_RDI);
    }
    else {
      Slice::Slice((Slice *)&stack0xffffffffffffffe8,in_RDI->_current);
      this_00 = (SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                in_RDI->_current;
      VVar3 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSize(this_00)
      ;
      Slice::Slice(&local_8,(uint8_t *)(this_00 + VVar3));
    }
    return (Slice)local_8._start;
  }
  uVar2 = __cxa_allocate_exception(0x18);
  Exception::Exception(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  __cxa_throw(uVar2,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

[[nodiscard]] Slice value() const {
    if (VELOCYPACK_UNLIKELY(!valid())) {
      throw Exception{Exception::IndexOutOfBounds};
    }
    if (_current != nullptr) {
      Slice key(_current);
      return Slice(_current + key.byteSize());
    }
    return _slice.getNthValue(_position);
  }